

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphical_model.h
# Opt level: O2

vector<merlin::factor,_std::allocator<merlin::factor>_> * __thiscall
merlin::graphical_model::assert_evidence
          (vector<merlin::factor,_std::allocator<merlin::factor>_> *__return_storage_ptr__,
          graphical_model *this,
          map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
          *evidence,
          map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
          *old_to_new)

{
  double dVar1;
  _func_int **pp_Var2;
  _Base_ptr v_state;
  pointer puVar3;
  bool bVar4;
  _Base_ptr p_Var5;
  mapped_type *pmVar6;
  ostream *poVar7;
  runtime_error *this_00;
  ulong uVar8;
  pointer pfVar9;
  long lVar10;
  mapped_type mVar11;
  vector<merlin::factor,_std::allocator<merlin::factor>_> temp;
  variable local_2a8;
  factor f;
  vindex old_idx;
  variable_set non_evid_vars;
  stringstream ss;
  ostream local_1a8 [376];
  
  non_evid_vars.m_dlocal.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  non_evid_vars.m_dlocal.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  non_evid_vars.m_d = (vsize *)0x0;
  non_evid_vars.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  non_evid_vars.m_dlocal.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  non_evid_vars.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  non_evid_vars.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  temp.super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  temp.super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  temp.super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pfVar9 = (this->m_factors).super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>.
           _M_impl.super__Vector_impl_data._M_start;
  do {
    if (pfVar9 == (this->m_factors).
                  super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
      for (mVar11 = 0;
          mVar11 != (long)non_evid_vars.m_v.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)non_evid_vars.m_v.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start >> 3; mVar11 = mVar11 + 1) {
        _ss = (_func_int **)
              non_evid_vars.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start[mVar11];
        pmVar6 = std::
                 map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                 ::operator[](old_to_new,(key_type *)&ss);
        *pmVar6 = mVar11;
      }
      (__return_storage_ptr__->super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>).
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>).
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      uVar8 = 0;
      while( true ) {
        pfVar9 = temp.super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if ((ulong)(((long)temp.super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)temp.super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>.
                          _M_impl.super__Vector_impl_data._M_start) / 0x60) <= uVar8) break;
        f.v_.m_dlocal.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        f.v_.m_dlocal.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        f.v_.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        f.v_.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        f._vptr_factor = (_func_int **)0x0;
        f.v_.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        f.v_.m_dlocal.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        for (lVar10 = 0;
            puVar3 = pfVar9[uVar8].v_.m_v.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start,
            lVar10 != (long)pfVar9[uVar8].v_.m_v.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)puVar3 >> 3;
            lVar10 = lVar10 + 1) {
          old_idx = puVar3[lVar10];
          pmVar6 = std::
                   map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                   ::operator[](old_to_new,&old_idx);
          _ss = (_func_int **)*pmVar6;
          variable_set::operator|=((variable_set *)&f,(variable *)&ss);
        }
        factor::factor((factor *)&ss,(variable_set *)&f,
                       pfVar9[uVar8].t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start);
        std::vector<merlin::factor,_std::allocator<merlin::factor>_>::emplace_back<merlin::factor>
                  (__return_storage_ptr__,(factor *)&ss);
        factor::~factor((factor *)&ss);
        variable_set::~variable_set((variable_set *)&f);
        uVar8 = uVar8 + 1;
      }
      std::vector<merlin::factor,_std::allocator<merlin::factor>_>::~vector(&temp);
      variable_set::~variable_set(&non_evid_vars);
      return __return_storage_ptr__;
    }
    factor::factor(&f,pfVar9);
    for (p_Var5 = (evidence->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var5 != &(evidence->_M_t)._M_impl.super__Rb_tree_header;
        p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
      pp_Var2 = *(_func_int ***)(p_Var5 + 1);
      v_state = p_Var5[1]._M_parent;
      dVar1 = (this->m_dims).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[(long)pp_Var2];
      uVar8 = (ulong)dVar1;
      if ((_Base_ptr)((long)(dVar1 - 9.223372036854776e+18) & (long)uVar8 >> 0x3f | uVar8) <=
          v_state) {
        std::__cxx11::stringstream::stringstream((stringstream *)&ss);
        poVar7 = std::operator<<(local_1a8,"Evidence value ");
        poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
        poVar7 = std::operator<<(poVar7," is outside variable\'s x");
        poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
        std::operator<<(poVar7," domain.");
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(this_00,(string *)&old_idx);
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      _ss = pp_Var2;
      bVar4 = variable_set::contains(&f.v_,(variable *)&ss);
      if (bVar4) {
        dVar1 = (this->m_dims).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[(long)pp_Var2];
        local_2a8.m_states = (size_t)dVar1;
        local_2a8.m_states =
             (long)(dVar1 - 9.223372036854776e+18) & (long)local_2a8.m_states >> 0x3f |
             local_2a8.m_states;
        local_2a8.m_label = (size_t)pp_Var2;
        variable_set::variable_set((variable_set *)&old_idx,&local_2a8);
        factor::condition((factor *)&ss,&f,(variable_set *)&old_idx,(vsize)v_state);
        factor::operator=(&f,(factor *)&ss);
        factor::~factor((factor *)&ss);
        variable_set::~variable_set((variable_set *)&old_idx);
      }
    }
    if ((long)f.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)f.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start == 8) {
      factor::binaryOpIP<merlin::factor::binOpTimes>(&this->m_global_const,&f);
    }
    else {
      std::vector<merlin::factor,_std::allocator<merlin::factor>_>::push_back(&temp,&f);
      variable_set::operator|=(&non_evid_vars,&f.v_);
    }
    factor::~factor(&f);
    pfVar9 = pfVar9 + 1;
  } while( true );
}

Assistant:

std::vector<factor> assert_evidence(const std::map<size_t, size_t>& evidence,
			std::map<size_t, size_t>& old_to_new) {

		// Condition the factors on the evidence, and accumulate the constant
		variable_set non_evid_vars;
		std::vector<factor> temp;
		std::vector<factor>::const_iterator it = m_factors.begin();
		for (; it != m_factors.end(); ++it) {
			factor f = (*it);
			for (std::map<size_t, size_t>::const_iterator mi = evidence.begin();
					mi != evidence.end(); ++mi) {
				size_t v = mi->first;
				size_t k = mi->second;

				// check if value is in domain
				if (k >= var(v).states()) {
					std::stringstream ss;
					ss << "Evidence value " << k << " is outside variable's x"
						<< v << " domain.";
					throw std::runtime_error(ss.str());
				}

				if (f.vars().contains(var(v))) {
					f = f.condition(var(v), k);
				}
			}

			if (f.isscalar()) {
				m_global_const *= f; // accumulate the global constant
			} else {
				temp.push_back(f);
				non_evid_vars |= f.vars();
			}
		}

		// Re-index the non-evidence variables
		vindex idx = 0;
		for (variable_set::const_iterator ci = non_evid_vars.begin();
				ci != non_evid_vars.end(); ++ci) {
			old_to_new[ci->label()] = idx;
			++idx;
		}

		std::vector<factor> result;
		for (size_t i = 0; i < temp.size(); ++i) {
			const factor& f = temp[i];
			variable_set vs;
			for (variable_set::const_iterator ci = f.vars().begin();
					ci != f.vars().end(); ++ci) {
				vindex old_idx = ci->label();
				size_t dim = ci->states();
				vindex new_idx = old_to_new[old_idx];
				vs |= variable(new_idx, dim);
			}

			result.push_back(factor(vs, (double*)f.table()));
		}

		return result;
	}